

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_store_ri(DisasContext_conflict1 *s,arg_ldst_ri *a,MemOp mop,int mem_idx)

{
  int reg;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  undefined1 extraout_AL;
  TCGv_i32 a32;
  TCGTemp *pTVar1;
  uintptr_t o;
  TCGv_i32 var;
  ISSInfo IVar2;
  
  s_00 = s->uc->tcg_ctx;
  IVar2 = ISSIsWrite|ISSInvalid;
  if ((a->p != 0) && (a->w == 0)) {
    IVar2 = a->rt | ISSIs16Bit;
    if ((s->base).pc_next - s->pc_curr != 2) {
      IVar2 = a->rt;
    }
    IVar2 = IVar2 | ISSIsWrite;
  }
  a32 = op_addr_ri_pre(s,a);
  reg = a->rt;
  s_01 = s->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)pTVar1 - (long)s_01);
  load_reg_var(s,var,reg);
  gen_aa32_st_i32(s,var,a32,mem_idx,s->be_data | mop);
  disas_set_da_iss(s,mop,IVar2);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
  op_addr_ri_post(s,a,a32,0);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_store_ri(DisasContext *s, arg_ldst_ri *a,
                        MemOp mop, int mem_idx)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    ISSInfo issinfo = make_issinfo(s, a->rt, a->p, a->w) | ISSIsWrite;
    TCGv_i32 addr, tmp;

    addr = op_addr_ri_pre(s, a);

    tmp = load_reg(s, a->rt);
    gen_aa32_st_i32(s, tmp, addr, mem_idx, mop | s->be_data);
    disas_set_da_iss(s, mop, issinfo);
    tcg_temp_free_i32(tcg_ctx, tmp);

    op_addr_ri_post(s, a, addr, 0);
    return true;
}